

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

void nifti_datatype_sizes(int datatype,int *nbyper,int *swapsize)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  if (datatype == 2) {
LAB_001094dc:
    iVar2 = 1;
    iVar1 = 0;
    goto LAB_0010950f;
  }
  if (datatype == 4) {
LAB_001094e8:
    iVar2 = 2;
    iVar1 = iVar2;
  }
  else {
    if ((datatype == 8) || (datatype == 0x10)) {
LAB_001094e4:
      iVar2 = 4;
      iVar1 = iVar2;
      goto LAB_0010950f;
    }
    if (datatype == 0x20) {
      iVar1 = 4;
      iVar2 = 8;
      goto LAB_0010950f;
    }
    if (datatype != 0x40) {
      if (datatype == 0x80) {
        iVar2 = 3;
        goto LAB_0010950f;
      }
      if (datatype == 0x900) {
        iVar2 = 4;
        goto LAB_0010950f;
      }
      if (datatype == 0x200) goto LAB_001094e8;
      if (datatype == 0x300) goto LAB_001094e4;
      if ((datatype != 0x400) && (datatype != 0x500)) {
        if (datatype == 0x600) {
          iVar2 = 0x10;
          iVar1 = iVar2;
          goto LAB_0010950f;
        }
        if (datatype == 0x700) {
          iVar1 = 8;
          iVar2 = 0x10;
          goto LAB_0010950f;
        }
        if (datatype == 0x800) {
          iVar1 = 0x10;
          iVar2 = 0x20;
          goto LAB_0010950f;
        }
        if (datatype != 0x100) {
          iVar2 = 0;
          iVar1 = 0;
          goto LAB_0010950f;
        }
        goto LAB_001094dc;
      }
    }
    iVar2 = 8;
    iVar1 = iVar2;
  }
LAB_0010950f:
  if (nbyper != (int *)0x0) {
    *nbyper = iVar2;
  }
  if (swapsize != (int *)0x0) {
    *swapsize = iVar1;
  }
  return;
}

Assistant:

void nifti_datatype_sizes( int datatype , int *nbyper, int *swapsize )
{
   int nb=0, ss=0 ;
   switch( datatype ){
     case DT_INT8:
     case DT_UINT8:       nb =  1 ; ss =  0 ; break ;

     case DT_INT16:
     case DT_UINT16:      nb =  2 ; ss =  2 ; break ;

     case DT_RGB24:       nb =  3 ; ss =  0 ; break ;
     case DT_RGBA32:      nb =  4 ; ss =  0 ; break ;

     case DT_INT32:
     case DT_UINT32:
     case DT_FLOAT32:     nb =  4 ; ss =  4 ; break ;

     case DT_COMPLEX64:   nb =  8 ; ss =  4 ; break ;

     case DT_FLOAT64:
     case DT_INT64:
     case DT_UINT64:      nb =  8 ; ss =  8 ; break ;

     case DT_FLOAT128:    nb = 16 ; ss = 16 ; break ;

     case DT_COMPLEX128:  nb = 16 ; ss =  8 ; break ;

     case DT_COMPLEX256:  nb = 32 ; ss = 16 ; break ;
   }

   ASSIF(nbyper,nb) ; ASSIF(swapsize,ss) ; return ;
}